

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

int lws_service(lws_context *context,int timeout_ms)

{
  undefined1 *puVar1;
  _func_void_lws_context_ptr_int *p_Var2;
  int iVar3;
  
  if (context == (lws_context *)0x0) {
    return 1;
  }
  puVar1 = &context->pt[0].field_0x19b;
  *puVar1 = *puVar1 | 1;
  p_Var2 = context->event_loop_ops->run_pt;
  if (p_Var2 == (_func_void_lws_context_ptr_int *)0x0) {
    iVar3 = lws_plat_service(context,timeout_ms);
    if (iVar3 == -1) {
      return -1;
    }
  }
  else {
    (*p_Var2)(context,0);
    iVar3 = 1;
  }
  puVar1 = &context->pt[0].field_0x19b;
  *puVar1 = *puVar1 & 0xfe;
  return iVar3;
}

Assistant:

int
lws_service(struct lws_context *context, int timeout_ms)
{
	struct lws_context_per_thread *pt;
	int n;

	if (!context)
		return 1;

	pt = &context->pt[0];
	pt->inside_service = 1;

	if (context->event_loop_ops->run_pt) {
		/* we are configured for an event loop */
		context->event_loop_ops->run_pt(context, 0);

		pt->inside_service = 0;

		return 1;
	}
	n = lws_plat_service(context, timeout_ms);

	if (n != -1)
		pt->inside_service = 0;

	return n;
}